

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemmtest.c
# Opt level: O3

void test(int data_type)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *__ptr;
  undefined4 extraout_var;
  long lVar5;
  DoubleComplex *pDVar6;
  DoubleComplex *pDVar7;
  long lVar8;
  char *__format;
  size_t __size;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  void *buf;
  void *local_f0;
  int hi [2];
  int lo [2];
  int ld;
  ulong local_d0;
  int local_c8;
  float beta_flt;
  undefined8 local_c0;
  long local_b8;
  long local_b0;
  float alpha_flt;
  SingleComplex beta_scpl;
  double beta_dbl;
  void *local_90;
  ulong local_88;
  ulong local_80;
  SingleComplex alpha_scpl;
  double alpha_dbl;
  DoubleComplex beta_dcpl;
  int dims [2];
  DoubleComplex alpha_dcpl;
  
  uVar11 = (ulong)(uint)data_type;
  iVar2 = GA_Nodeid();
  GA_Nnodes();
  dims[0] = 8;
  dims[1] = 8;
  lo[0] = 0;
  lo[1] = 0;
  hi[0] = 7;
  hi[1] = 7;
  alpha_dbl = 1.0;
  beta_dbl = 0.0;
  alpha_flt = 1.0;
  beta_flt = 0.0;
  alpha_dcpl.real = 1.0;
  alpha_dcpl.imag = 0.0;
  beta_dcpl.real = 0.0;
  beta_dcpl.imag = 0.0;
  alpha_scpl.real = 1.0;
  alpha_scpl.imag = 0.0;
  beta_scpl.real = 0.0;
  beta_scpl.imag = 0.0;
  iVar10 = data_type + -0x3eb;
  local_d0 = uVar11;
  switch(iVar10) {
  case 0:
    local_f0 = malloc(0x100);
    buf = malloc(0x100);
    __ptr = malloc(0x100);
    if (iVar2 == 0) {
      __format = "Single Precision: Testing GA_Sgemm,NGA_Matmul_patch for %d-Dimension";
      break;
    }
LAB_00103b7a:
    local_c0 = 0;
    goto LAB_00103bdf;
  case 1:
    local_f0 = malloc(0x200);
    buf = malloc(0x200);
    __ptr = malloc(0x200);
    if (iVar2 != 0) goto LAB_00103b7a;
    __format = "Double Precision: Testing GA_Dgemm,NGA_Matmul_patch for %d-Dimension";
    break;
  default:
    GA_Error("wrong data type",data_type);
    __ptr = (void *)0x0;
    buf = (void *)0x0;
    local_f0 = (void *)0x0;
    local_c0 = 0;
    if (iVar2 != 0) goto LAB_00103bdf;
    goto LAB_00103bcc;
  case 3:
    local_f0 = malloc(0x200);
    buf = malloc(0x200);
    __ptr = malloc(0x200);
    if (iVar2 != 0) goto LAB_00103b7a;
    __format = "Single Complex:   Testing GA_Cgemm,NGA_Matmul_patch for %d-Dimension";
    break;
  case 4:
    local_f0 = malloc(0x400);
    buf = malloc(0x400);
    __ptr = malloc(0x400);
    if (iVar2 != 0) goto LAB_00103b7a;
    __format = "Double Complex:   Testing GA_Zgemm,NGA_Matmul_patch for %d-Dimension";
  }
  printf(__format,2);
LAB_00103bcc:
  iVar2 = puts("\nCreate A, B, C");
  local_c0._1_7_ = (undefined7)(CONCAT44(extraout_var,iVar2) >> 8);
  local_c0._0_1_ = 1;
LAB_00103bdf:
  iVar2 = NGA_Create((int)local_d0,2,dims,"array A",(int *)0x0);
  uVar3 = GA_Duplicate(iVar2,"array B");
  uVar11 = (ulong)uVar3;
  uVar4 = GA_Duplicate(iVar2,"array C");
  uVar9 = (ulong)uVar4;
  if ((uVar3 == 0 || iVar2 == 0) || uVar4 == 0) {
    GA_Error("Create failed: a, b or c",1);
  }
  ld = 8;
  local_c8 = iVar2;
  local_88 = uVar9;
  local_80 = uVar11;
  if ((char)local_c0 == '\0') {
    GA_Sync();
    GA_Sync();
  }
  else {
    local_90 = __ptr;
    puts("\nInitialize A");
    lVar12 = 0;
    iVar2 = 0;
    lVar5 = 0;
    do {
      lVar8 = 0;
      local_b8 = lVar12;
      local_b0 = lVar5;
      do {
        iVar1 = (int)lVar8;
        switch(iVar10) {
        case 0:
          *(float *)((long)local_f0 + lVar12) = (float)(iVar2 + iVar1);
          break;
        case 1:
          *(double *)((long)local_f0 + lVar12 * 2) = (double)(iVar2 + iVar1);
          break;
        default:
          GA_Error("wrong data type",(int)local_d0);
          break;
        case 3:
          *(float *)((long)local_f0 + lVar12 * 2) = (float)(iVar2 + iVar1);
          *(undefined4 *)((long)local_f0 + lVar12 * 2 + 4) = 0x3f800000;
          break;
        case 4:
          *(double *)((long)local_f0 + lVar12 * 4) = (double)(iVar2 + iVar1);
          *(undefined8 *)((long)local_f0 + lVar12 * 4 + 8) = 0x3ff0000000000000;
        }
        lVar8 = lVar8 + 1;
        lVar12 = lVar12 + 4;
      } while (lVar8 != 8);
      lVar5 = local_b0 + 1;
      iVar2 = iVar2 + 8;
      lVar12 = local_b8 + 0x20;
    } while (lVar5 != 8);
    NGA_Put(local_c8,lo,hi,local_f0,&ld);
    GA_Sync();
    puts("\nInitialize B");
    lVar12 = 0;
    lVar5 = 0;
    do {
      lVar8 = 0;
      local_b8 = lVar12;
      do {
        iVar2 = (int)lVar5;
        iVar1 = (int)lVar8;
        switch(iVar10) {
        case 0:
          *(float *)((long)buf + lVar12 * 2) = (float)(iVar2 + iVar1);
          break;
        case 1:
          *(double *)((long)buf + lVar12 * 4) = (double)(iVar2 + iVar1);
          break;
        default:
          GA_Error("wrong data type",(int)local_d0);
          break;
        case 3:
          *(float *)((long)buf + lVar12 * 4) = (float)(iVar2 + iVar1);
          *(undefined4 *)((long)buf + lVar12 * 4 + 4) = 0x3f800000;
          break;
        case 4:
          *(double *)((long)buf + lVar12 * 8) = (double)(iVar2 + iVar1);
          *(undefined8 *)((long)buf + lVar12 * 8 + 8) = 0x3ff0000000000000;
        }
        uVar11 = local_80;
        lVar8 = lVar8 + 8;
        lVar12 = lVar12 + 2;
      } while (lVar8 != 0x40);
      lVar5 = lVar5 + 1;
      lVar12 = local_b8 + 0x10;
    } while (lVar5 != 8);
    NGA_Put((int)local_80,lo,hi,buf,&ld);
    GA_Sync();
    puts("\nPerform matrix multiply");
    __ptr = local_90;
    uVar9 = local_88;
    iVar2 = local_c8;
  }
  switch(iVar10) {
  case 0:
    pDVar7 = (DoubleComplex *)&alpha_flt;
    pDVar6 = (DoubleComplex *)&beta_flt;
    break;
  case 1:
    pDVar7 = (DoubleComplex *)&alpha_dbl;
    pDVar6 = (DoubleComplex *)&beta_dbl;
    break;
  default:
    GA_Error("wrong data type",(int)local_d0);
    goto LAB_00103f39;
  case 3:
    pDVar7 = (DoubleComplex *)&alpha_scpl;
    pDVar6 = (DoubleComplex *)&beta_scpl;
    break;
  case 4:
    pDVar7 = &alpha_dcpl;
    pDVar6 = &beta_dcpl;
  }
  NGA_Matmul_patch('N','N',pDVar7,pDVar6,iVar2,lo,hi,(int)uVar11,lo,hi,(int)uVar9,lo,hi);
LAB_00103f39:
  GA_Sync();
  free(local_f0);
  free(buf);
  free(__ptr);
  switch(iVar10) {
  case 0:
    local_f0 = malloc(0x40);
    buf = malloc(0x40);
    __size = 0x40;
    break;
  case 1:
  case 3:
    local_f0 = malloc(0x80);
    buf = malloc(0x80);
    __size = 0x80;
    break;
  default:
    GA_Error("wrong data type",(int)local_d0);
    goto LAB_00103fe1;
  case 4:
    local_f0 = malloc(0x100);
    buf = malloc(0x100);
    __size = 0x100;
  }
  __ptr = malloc(__size);
LAB_00103fe1:
  GA_Zero(iVar2);
  GA_Zero((int)uVar11);
  GA_Zero((int)uVar9);
  if ((char)local_c0 == '\0') {
    lo[0] = 2;
    lo[1] = 2;
    hi[0] = 5;
    hi[1] = 5;
    ld = 4;
    GA_Sync();
    GA_Sync();
    beta_flt = 0.0;
    beta_dbl = 0.0;
    beta_scpl = (SingleComplex)((ulong)beta_scpl & 0xffffffff00000000);
    beta_dcpl.real = 0.0;
  }
  else {
    local_90 = __ptr;
    puts("\nTest patch multiply");
    lo[0] = 2;
    lo[1] = 2;
    hi[0] = 5;
    hi[1] = 5;
    ld = 4;
    puts("\nInitialize A");
    lVar5 = 2;
    iVar2 = 0x12;
    lVar12 = 0;
    do {
      lVar8 = 0;
      local_b8 = lVar5;
      local_b0 = lVar12;
      do {
        iVar1 = (int)lVar8;
        switch(iVar10) {
        case 0:
          *(float *)((long)local_f0 + lVar12 * 2) = (float)(iVar2 + iVar1);
          break;
        case 1:
          *(double *)((long)local_f0 + lVar12 * 4) = (double)(iVar2 + iVar1);
          break;
        default:
          GA_Error("wrong data type",(int)local_d0);
          break;
        case 3:
          *(float *)((long)local_f0 + lVar12 * 4) = (float)(iVar2 + iVar1);
          *(undefined4 *)((long)local_f0 + lVar12 * 4 + 4) = 0x3f800000;
          break;
        case 4:
          *(double *)((long)local_f0 + lVar12 * 8) = (double)(iVar2 + iVar1);
          *(undefined8 *)((long)local_f0 + lVar12 * 8 + 8) = 0x3ff0000000000000;
        }
        lVar8 = lVar8 + 1;
        lVar12 = lVar12 + 2;
      } while (lVar8 != 4);
      lVar5 = local_b8 + 1;
      iVar2 = iVar2 + 8;
      lVar12 = local_b0 + 8;
    } while (lVar5 != 6);
    NGA_Put(local_c8,lo,hi,local_f0,&ld);
    GA_Sync();
    puts("\nInitialize B");
    lVar5 = 2;
    iVar2 = 0x12;
    lVar12 = 0;
    do {
      lVar8 = 0;
      local_b8 = lVar5;
      local_b0 = lVar12;
      do {
        iVar1 = (int)lVar8;
        switch(iVar10) {
        case 0:
          *(float *)((long)buf + lVar12) = (float)(iVar2 + iVar1);
          break;
        case 1:
          *(double *)((long)buf + lVar12 * 2) = (double)(iVar2 + iVar1);
          break;
        default:
          GA_Error("wrong data type",(int)local_d0);
          break;
        case 3:
          *(float *)((long)buf + lVar12 * 2) = (float)(iVar2 + iVar1);
          *(undefined4 *)((long)buf + lVar12 * 2 + 4) = 0x3f800000;
          break;
        case 4:
          *(double *)((long)buf + lVar12 * 4) = (double)(iVar2 + iVar1);
          *(undefined8 *)((long)buf + lVar12 * 4 + 8) = 0x3ff0000000000000;
        }
        uVar11 = local_80;
        lVar8 = lVar8 + 8;
        lVar12 = lVar12 + 4;
      } while (lVar8 != 0x20);
      lVar5 = local_b8 + 1;
      iVar2 = iVar2 + 1;
      lVar12 = local_b0 + 0x10;
    } while (lVar5 != 6);
    NGA_Put((int)local_80,lo,hi,buf,&ld);
    GA_Sync();
    beta_flt = 0.0;
    beta_dbl = 0.0;
    beta_scpl = (SingleComplex)((ulong)beta_scpl & 0xffffffff00000000);
    beta_dcpl.real = 0.0;
    puts("\nPerform matrix multiply on sub-blocks");
    __ptr = local_90;
    uVar9 = local_88;
    iVar2 = local_c8;
  }
  switch(iVar10) {
  case 0:
    pDVar7 = (DoubleComplex *)&alpha_flt;
    pDVar6 = (DoubleComplex *)&beta_flt;
    break;
  case 1:
    pDVar7 = (DoubleComplex *)&alpha_dbl;
    pDVar6 = (DoubleComplex *)&beta_dbl;
    break;
  default:
    GA_Error("wrong data type",(int)local_d0);
    goto LAB_00104370;
  case 3:
    pDVar7 = (DoubleComplex *)&alpha_scpl;
    pDVar6 = (DoubleComplex *)&beta_scpl;
    break;
  case 4:
    pDVar7 = &alpha_dcpl;
    pDVar6 = &beta_dcpl;
  }
  NGA_Matmul_patch('N','N',pDVar7,pDVar6,iVar2,lo,hi,(int)uVar11,lo,hi,(int)uVar9,lo,hi);
LAB_00104370:
  GA_Sync();
  free(local_f0);
  free(buf);
  free(__ptr);
  GA_Destroy(iVar2);
  GA_Destroy((int)uVar11);
  GA_Destroy((int)uVar9);
  return;
}

Assistant:

void
test(int data_type) {
  int me=GA_Nodeid();
  int nproc = GA_Nnodes();
  int g_a, g_b, g_c;
  int ndim = 2;
  int dims[2]={N,N};
  int lo[2]={0,0};
  int hi[2]={N-1,N-1};
  int block_size[2]={NB,NB-1};
  int proc_grid[2];
  int i,j,l,k,m,n, ld;

  double alpha_dbl = 1.0, beta_dbl = 0.0;
  double dzero = 0.0;
  double ddiff;

  float alpha_flt = 1.0, beta_flt = 0.0;
  float fzero = 0.0;
  float fdiff;
  float ftmp;
  double dtmp;
  SingleComplex ctmp;
  DoubleComplex ztmp;

  DoubleComplex alpha_dcpl = {1.0, 0.0} , beta_dcpl = {0.0, 0.0}; 
  DoubleComplex zzero = {0.0,0.0};
  DoubleComplex zdiff;

  SingleComplex alpha_scpl = {1.0, 0.0} , beta_scpl = {0.0, 0.0}; 
  SingleComplex czero = {0.0,0.0};
  SingleComplex cdiff;

  void *alpha=NULL, *beta=NULL;
  void *abuf=NULL, *bbuf=NULL, *cbuf=NULL, *c_ptr=NULL;

  switch (data_type) {
  case C_FLOAT:
    alpha  = (void *)&alpha_flt;
    beta   = (void *)&beta_flt;
    abuf = (void*)malloc(N*N*sizeof(float));
    bbuf = (void*)malloc(N*N*sizeof(float));
    cbuf = (void*)malloc(N*N*sizeof(float));
    if(me==0) printf("Single Precision: Testing GA_Sgemm,NGA_Matmul_patch for %d-Dimension", ndim);
    break;      
  case C_DBL:
    alpha  = (void *)&alpha_dbl;
    beta   = (void *)&beta_dbl;
    abuf = (void*)malloc(N*N*sizeof(double));
    bbuf = (void*)malloc(N*N*sizeof(double));
    cbuf = (void*)malloc(N*N*sizeof(double));
    if(me==0) printf("Double Precision: Testing GA_Dgemm,NGA_Matmul_patch for %d-Dimension", ndim); 
    break;    
  case C_DCPL:
    alpha  = (void *)&alpha_dcpl;
    beta   = (void *)&beta_dcpl;
    abuf = (void*)malloc(N*N*sizeof(DoubleComplex));
    bbuf = (void*)malloc(N*N*sizeof(DoubleComplex));
    cbuf = (void*)malloc(N*N*sizeof(DoubleComplex));
    if(me==0) printf("Double Complex:   Testing GA_Zgemm,NGA_Matmul_patch for %d-Dimension", ndim);
    break;
  case C_SCPL:
    alpha  = (void *)&alpha_scpl;
    beta   = (void *)&beta_scpl;
    abuf = (void*)malloc(N*N*sizeof(SingleComplex));
    bbuf = (void*)malloc(N*N*sizeof(SingleComplex));
    cbuf = (void*)malloc(N*N*sizeof(SingleComplex));
    if(me==0) printf("Single Complex:   Testing GA_Cgemm,NGA_Matmul_patch for %d-Dimension", ndim);
    break;
  default:
    GA_Error("wrong data type", data_type);
  }

  if (me==0) printf("\nCreate A, B, C\n");
#ifdef USE_REGULAR
  g_a = NGA_Create(data_type, ndim, dims, "array A", NULL);
#endif
#ifdef USE_SIMPLE_CYCLIC
  g_a = NGA_Create_handle();
  NGA_Set_data(g_a,ndim,dims,data_type);
  NGA_Set_array_name(g_a,"array A");
  NGA_Set_block_cyclic(g_a,block_size);
  if (!GA_Allocate(g_a)) {
    GA_Error("Failed: create: g_a",40);
  }
#endif
#ifdef USE_SCALAPACK
  g_a = NGA_Create_handle();
  NGA_Set_data(g_a,ndim,dims,data_type);
  NGA_Set_array_name(g_a,"array A");
  grid_factor(nproc,&i,&j);
  proc_grid[0] = i;
  proc_grid[1] = j;
  NGA_Set_block_cyclic_proc_grid(g_a,block_size,proc_grid);
  if (!GA_Allocate(g_a)) {
    GA_Error("Failed: create: g_a",40);
  }
#endif
#ifdef USE_TILED
  g_a = NGA_Create_handle();
  NGA_Set_data(g_a,ndim,dims,data_type);
  NGA_Set_array_name(g_a,"array A");
  grid_factor(nproc,&i,&j);
  proc_grid[0] = i;
  proc_grid[1] = j;
  NGA_Set_tiled_proc_grid(g_a,block_size,proc_grid);
  if (!GA_Allocate(g_a)) {
    GA_Error("Failed: create: g_a",40);
  }
#endif
  g_b = GA_Duplicate(g_a, "array B");  
  g_c = GA_Duplicate(g_a, "array C");
  if(!g_a || !g_b || !g_c) GA_Error("Create failed: a, b or c",1);

  ld = N;
  if (me==0) printf("\nInitialize A\n");
  /* Set up matrix A */
  if (me == 0) {
    for (i=0; i<N; i++) {
      for (j=0; j<N; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)abuf)[i*N+j] = (float)(i*N+j);
            break;
          case C_DBL:
            ((double*)abuf)[i*N+j] = (double)(i*N+j);
            break;
          case C_DCPL:
            ((DoubleComplex*)abuf)[i*N+j].real = (double)(i*N+j);
            ((DoubleComplex*)abuf)[i*N+j].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)abuf)[i*N+j].real = (float)(i*N+j);
            ((SingleComplex*)abuf)[i*N+j].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_a,lo,hi,abuf,&ld);
  }
  GA_Sync();

  if (me==0) printf("\nInitialize B\n");
  /* Set up matrix B */
  if (me == 0) {
    for (i=0; i<N; i++) {
      for (j=0; j<N; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)bbuf)[i*N+j] = (float)(j*N+i);
            break;
          case C_DBL:
            ((double*)bbuf)[i*N+j] = (double)(j*N+i);
            break;
          case C_DCPL:
            ((DoubleComplex*)bbuf)[i*N+j].real = (double)(j*N+i);
            ((DoubleComplex*)bbuf)[i*N+j].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)bbuf)[i*N+j].real = (float)(j*N+i);
            ((SingleComplex*)bbuf)[i*N+j].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_b,lo,hi,bbuf,&ld);
  }
  GA_Sync();

  if (me==0) printf("\nPerform matrix multiply\n");
  switch (data_type) {
    case C_FLOAT:
      NGA_Matmul_patch('N','N',&alpha_flt,&beta_flt,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DBL:
      NGA_Matmul_patch('N','N',&alpha_dbl,&beta_dbl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_SCPL:
      NGA_Matmul_patch('N','N',&alpha_scpl,&beta_scpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DCPL:
      NGA_Matmul_patch('N','N',&alpha_dcpl,&beta_dcpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  GA_Sync();
#if 0
  if (me==0) printf("\nCheck answer\n");
  /*
  GA_Print(g_a);
  if (me == 0) printf("\n\n\n\n");
  GA_Print(g_b);
  if (me == 0) printf("\n\n\n\n");
  GA_Print(g_c); 
  */

  /* Check answer */
  NGA_Get(g_a,lo,hi,abuf,&ld);
  NGA_Get(g_b,lo,hi,bbuf,&ld);
  for (i=0; i<N; i++) {
    for (j=0; j<N; j++) {
      switch (data_type) {
        case C_FLOAT:
          ((float*)cbuf)[i*N+j] = fzero;
          break;
        case C_DBL:
          ((double*)cbuf)[i*N+j] = dzero;
          break;
        case C_DCPL:
          ((DoubleComplex*)cbuf)[i*N+j] = zzero;
          break;
        case C_SCPL:
          ((SingleComplex*)cbuf)[i*N+j] = czero;
          break;
        default:
          GA_Error("wrong data type", data_type);
      }
      for (k=0; k<N; k++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)cbuf)[i*N+j] += ((float*)abuf)[i*N+k]
              *((float*)bbuf)[k*N+j];
            break;
          case C_DBL:
            ((double*)cbuf)[i*N+j] += ((double*)abuf)[i*N+k]
              *((double*)bbuf)[k*N+j];
            break;
          case C_DCPL:
            ((DoubleComplex*)cbuf)[i*N+j].real +=
              (((DoubleComplex*)abuf)[i*N+k].real
               *((DoubleComplex*)bbuf)[k*N+j].real
               -(((DoubleComplex*)abuf)[i*N+k].imag
                 *((DoubleComplex*)bbuf)[k*N+j].imag));
            ((DoubleComplex*)cbuf)[i*N+j].imag +=
              (((DoubleComplex*)abuf)[i*N+k].real
               *((DoubleComplex*)bbuf)[k*N+j].imag
               +(((DoubleComplex*)abuf)[i*N+k].imag
                 *((DoubleComplex*)bbuf)[k*N+j].real));
            break;
          case C_SCPL:
            ((SingleComplex*)cbuf)[i*N+j].real +=
              (((SingleComplex*)abuf)[i*N+k].real
               *((SingleComplex*)bbuf)[k*N+j].real
               -(((SingleComplex*)abuf)[i*N+k].imag
                 *((SingleComplex*)bbuf)[k*N+j].imag));
            ((SingleComplex*)cbuf)[i*N+j].imag +=
              (((SingleComplex*)abuf)[i*N+k].real
               *((SingleComplex*)bbuf)[k*N+j].imag
               +(((SingleComplex*)abuf)[i*N+k].imag
                 *((SingleComplex*)bbuf)[k*N+j].real));
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
  }
  GA_Sync();
  if (me == 0) {
    NGA_Get(g_c,lo,hi,abuf,&ld);
    for (i=0; i<N; i++) {
      for (j=0; j<N; j++) {
        switch (data_type) {
          case C_FLOAT:
            fdiff = ((float*)abuf)[i*N+j]-((float*)cbuf)[i*N+j];
            if (((float*)abuf)[i*N+j] != 0.0) {
              fdiff /= ((float*)abuf)[i*N+j];
            }
            if (fabs(fdiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: %f Expected: %f\n",me,i,j,
                  ((float*)abuf)[i*N+j],((float*)cbuf)[i*N+j]);
            }
            break;
          case C_DBL:
            ddiff = ((double*)abuf)[i*N+j]-((double*)cbuf)[i*N+j];
            if (((double*)abuf)[i*N+j] != 0.0) {
              ddiff /= ((double*)abuf)[i*N+j];
            }
            if (fabs(ddiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: %f Expected: %f\n",me,i,j,
                  ((double*)abuf)[i*N+j],((double*)cbuf)[i*N+j]);
            }
            break;
          case C_DCPL:
            zdiff.real = ((DoubleComplex*)abuf)[i*N+j].real
              -((DoubleComplex*)cbuf)[i*N+j].real;
            zdiff.imag = ((DoubleComplex*)abuf)[i*N+j].imag
              -((DoubleComplex*)cbuf)[i*N+j].imag;
            if (((DoubleComplex*)abuf)[i*N+j].real != 0.0 ||
                ((DoubleComplex*)abuf)[i*N+j].imag != 0.0) {
              ztmp = ((DoubleComplex*)abuf)[i*N+j];
              ddiff = sqrt((zdiff.real*zdiff.real+zdiff.imag*zdiff.imag)
                  /(ztmp.real*ztmp.real+ztmp.imag*ztmp.imag));
            } else {
              ddiff = sqrt(zdiff.real*zdiff.real+zdiff.imag*zdiff.imag);
            }
            if (fabs(ddiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: (%f,%f) Expected: (%f,%f)\n",me,i,j,
                  ((DoubleComplex*)abuf)[i*N+j].real,
                  ((DoubleComplex*)abuf)[i*N+j].imag,
                  ((DoubleComplex*)cbuf)[i*N+j].real,
                  ((DoubleComplex*)cbuf)[i*N+j].imag);
            }
            break;
          case C_SCPL:
            cdiff.real = ((SingleComplex*)abuf)[i*N+j].real
              -((SingleComplex*)cbuf)[i*N+j].real;
            cdiff.imag = ((SingleComplex*)abuf)[i*N+j].imag
              -((SingleComplex*)cbuf)[i*N+j].imag;
            if (((SingleComplex*)abuf)[i*N+j].real != 0.0 ||
                ((SingleComplex*)abuf)[i*N+j].imag != 0.0) {
              ctmp = ((SingleComplex*)abuf)[i*N+j];
              fdiff = sqrt((cdiff.real*cdiff.real+cdiff.imag*cdiff.imag)
                  /(ctmp.real*ctmp.real+ctmp.imag*ctmp.imag));
            } else {
              fdiff = sqrt(cdiff.real*cdiff.real+cdiff.imag*cdiff.imag);
            }
            if (fabs(fdiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: (%f,%f) Expected: (%f,%f)\n",me,i,j,
                  ((SingleComplex*)abuf)[i*N+j].real,
                  ((SingleComplex*)abuf)[i*N+j].imag,
                  ((SingleComplex*)cbuf)[i*N+j].real,
                  ((SingleComplex*)cbuf)[i*N+j].imag);
            }
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
  }
  GA_Sync();

  /* copy cbuf back to g_a */
  if (me == 0) {
    NGA_Put(g_a,lo,hi,cbuf,&ld);
  }
  GA_Sync();

  /* Get norm of g_a */
  switch (data_type) {
    case C_FLOAT:
      ftmp = GA_Fdot(g_a,g_a);
      break;
    case C_DBL:
      dtmp = GA_Ddot(g_a,g_a);
      break;
    case C_DCPL:
      ztmp = GA_Zdot(g_a,g_a);
      break;
    case C_SCPL:
      ctmp = GA_Cdot(g_a,g_a);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  /* subtract C from A and put the results in B */
  beta_flt = -1.0;
  beta_dbl = -1.0;
  beta_scpl.real = -1.0;
  beta_dcpl.real = -1.0;
  GA_Zero(g_b);
  GA_Add(alpha,g_a,beta,g_c,g_b);
  /* evaluate the norm of the difference between the two matrices */
  switch (data_type) {
    case C_FLOAT:
      fdiff = GA_Fdot(g_b, g_b);
      if (ftmp != 0.0) {
        fdiff /= ftmp;
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(fdiff), TOLERANCE);
        GA_Error("GA_Sgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Sgemm OK\n\n");
      }
      break;
    case C_DBL:
      ddiff = GA_Ddot(g_b, g_b);
      if (dtmp != 0.0) {
        ddiff /= dtmp;
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(ddiff), TOLERANCE);
        GA_Error("GA_Dgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Dgemm OK\n\n");
      }
      break;
    case C_DCPL:
      zdiff = GA_Zdot(g_b, g_b);
      if (ztmp.real != 0.0 || ztmp.imag != 0.0) {
        ddiff = sqrt((zdiff.real*zdiff.real+zdiff.imag*zdiff.imag)
            /(ztmp.real*ztmp.real+ztmp.imag*ztmp.imag));
      } else {
        ddiff = sqrt(zdiff.real*zdiff.real+zdiff.imag*zdiff.imag);
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(zdiff.real), TOLERANCE);
        GA_Error("GA_Zgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Zgemm OK\n\n");
      }
      break;
    case C_SCPL:
      cdiff = GA_Cdot(g_b, g_b);
      if (ctmp.real != 0.0 || ctmp.imag != 0.0) {
        fdiff = sqrt((cdiff.real*cdiff.real+cdiff.imag*cdiff.imag)
            /(ctmp.real*ctmp.real+ctmp.imag*ctmp.imag));
      } else {
        fdiff = sqrt(cdiff.real*cdiff.real+cdiff.imag*cdiff.imag);
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(cdiff.real), TOLERANCE);
        GA_Error("GA_Cgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Cgemm OK\n\n");
      }
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
#endif

  free(abuf);
  free(bbuf);
  free(cbuf);

  switch (data_type) {
  case C_FLOAT:
    abuf = (void*)malloc(N*N*sizeof(float)/4);
    bbuf = (void*)malloc(N*N*sizeof(float)/4);
    cbuf = (void*)malloc(N*N*sizeof(float)/4);
    break;      
  case C_DBL:
    abuf = (void*)malloc(N*N*sizeof(double)/4);
    bbuf = (void*)malloc(N*N*sizeof(double)/4);
    cbuf = (void*)malloc(N*N*sizeof(double)/4);
    break;    
  case C_DCPL:
    abuf = (void*)malloc(N*N*sizeof(DoubleComplex)/4);
    bbuf = (void*)malloc(N*N*sizeof(DoubleComplex)/4);
    cbuf = (void*)malloc(N*N*sizeof(DoubleComplex)/4);
    break;
  case C_SCPL:
    abuf = (void*)malloc(N*N*sizeof(SingleComplex)/4);
    bbuf = (void*)malloc(N*N*sizeof(SingleComplex)/4);
    cbuf = (void*)malloc(N*N*sizeof(SingleComplex)/4);
    break;
  default:
    GA_Error("wrong data type", data_type);
  }

  /* Test multiply on a fraction of matrix. Start by reinitializing
   * A and B */
  GA_Zero(g_a);
  GA_Zero(g_b);
  GA_Zero(g_c);

  if (me==0) printf("\nTest patch multiply\n");

  lo[0] = N/4;
  lo[1] = N/4;
  hi[0] = 3*N/4-1;
  hi[1] = 3*N/4-1;
  ld = N/2;

  /* Set up matrix A */
  if (me==0) printf("\nInitialize A\n");
  if (me == 0) {
    for (i=N/4; i<3*N/4; i++) {
      for (j=N/4; j<3*N/4; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)abuf)[(i-N/4)*N/2+(j-N/4)] = (float)(i*N+j);
            break;
          case C_DBL:
            ((double*)abuf)[(i-N/4)*N/2+(j-N/4)] = (double)(i*N+j);
            break;
          case C_DCPL:
            ((DoubleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].real = (double)(i*N+j);
            ((DoubleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].real = (float)(i*N+j);
            ((SingleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_a,lo,hi,abuf,&ld);
  }
  GA_Sync();

  if (me==0) printf("\nInitialize B\n");
  /* Set up matrix B */
  if (me == 0) {
    for (i=N/4; i<3*N/4; i++) {
      for (j=N/4; j<3*N/4; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)bbuf)[(i-N/4)*N/2+(j-N/4)] = (float)(j*N+i);
            break;
          case C_DBL:
            ((double*)bbuf)[(i-N/4)*N/2+(j-N/4)] = (double)(j*N+i);
            break;
          case C_DCPL:
            ((DoubleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].real = (double)(j*N+i);
            ((DoubleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].real = (float)(j*N+i);
            ((SingleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_b,lo,hi,bbuf,&ld);
  }
  GA_Sync();

  beta_flt = 0.0;
  beta_dbl = 0.0;
  beta_scpl.real = 0.0;
  beta_dcpl.real = 0.0;
  if (me==0) printf("\nPerform matrix multiply on sub-blocks\n");
  switch (data_type) {
    case C_FLOAT:
      NGA_Matmul_patch('N','N',&alpha_flt,&beta_flt,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DBL:
      NGA_Matmul_patch('N','N',&alpha_dbl,&beta_dbl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_SCPL:
      NGA_Matmul_patch('N','N',&alpha_scpl,&beta_scpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DCPL:
      NGA_Matmul_patch('N','N',&alpha_dcpl,&beta_dcpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  GA_Sync();
#if 0
  if (0) {
  /*
  if (data_type != C_SCPL && data_type != C_DCPL) {
  */

  if (me==0) printf("\nCheck answer\n");

  /* Multiply buffers by hand */
  if (me == 0) {
    for (i=0; i<N/2; i++) {
      for (j=0; j<N/2; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)cbuf)[i*N/2+j] = fzero;
            break;
          case C_DBL:
            ((double*)cbuf)[i*N/2+j] = dzero;
            break;
          case C_DCPL:
            ((DoubleComplex*)cbuf)[i*N/2+j] = zzero;
            break;
          case C_SCPL:
            ((SingleComplex*)cbuf)[i*N/2+j] = czero;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
        for (k=0; k<N/2; k++) {
          switch (data_type) {
            case C_FLOAT:
              ((float*)cbuf)[i*N/2+j] += ((float*)abuf)[i*N/2+k]
                *((float*)bbuf)[k*N/2+j];
              break;
            case C_DBL:
              ((double*)cbuf)[i*N/2+j] += ((double*)abuf)[i*N/2+k]
                *((double*)bbuf)[k*N/2+j];
              break;
            case C_DCPL:
              ((DoubleComplex*)cbuf)[i*N/2+j].real +=
                (((DoubleComplex*)abuf)[i*N/2+k].real
                 *((DoubleComplex*)bbuf)[k*N/2+j].real
                 -(((DoubleComplex*)abuf)[i*N/2+k].imag
                   *((DoubleComplex*)bbuf)[k*N/2+j].imag));
              ((DoubleComplex*)cbuf)[i*N/2+j].imag +=
                (((DoubleComplex*)abuf)[i*N/2+k].real
                 *((DoubleComplex*)bbuf)[k*N/2+j].imag
                 +(((DoubleComplex*)abuf)[i*N/2+k].imag
                   *((DoubleComplex*)bbuf)[k*N/2+j].real));
              break;
            case C_SCPL:
              ((SingleComplex*)cbuf)[i*N/2+j].real +=
                (((SingleComplex*)abuf)[i*N/2+k].real
                 *((SingleComplex*)bbuf)[k*N/2+j].real
                 -(((SingleComplex*)abuf)[i*N/2+k].imag
                   *((SingleComplex*)bbuf)[k*N/2+j].imag));
              ((SingleComplex*)cbuf)[i*N/2+j].imag +=
                (((SingleComplex*)abuf)[i*N/2+k].real
                 *((SingleComplex*)bbuf)[k*N/2+j].imag
                 +(((SingleComplex*)abuf)[i*N/2+k].imag
                   *((SingleComplex*)bbuf)[k*N/2+j].real));
              break;
            default:
              GA_Error("wrong data type", data_type);
          }
        }
      }
    }
    NGA_Put(g_a,lo,hi,cbuf,&ld);
  }
  if (me == 0) printf("\n\n\n\n");

  /* Get norm of g_a */
  switch (data_type) {
    case C_FLOAT:
      ftmp = NGA_Fdot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    case C_DBL:
      dtmp = NGA_Ddot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    case C_DCPL:
      ztmp = NGA_Zdot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    case C_SCPL:
      ctmp = NGA_Cdot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  /* subtract C from A and put the results in B */
  beta_flt = -1.0;
  beta_dbl = -1.0;
  beta_scpl.real = -1.0;
  beta_dcpl.real = -1.0;
  NGA_Zero_patch(g_b,lo,hi);
  NGA_Add_patch(alpha,g_a,lo,hi,beta,g_c,lo,hi,g_b,lo,hi);
  /* evaluate the norm of the difference between the two matrices */
  switch (data_type) {
    case C_FLOAT:
      fdiff = NGA_Fdot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (ftmp != 0.0) {
        fdiff /= ftmp;
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(fdiff), TOLERANCE);
        GA_Error("GA_Sgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Sgemm OK\n\n");
      }
      break;
    case C_DBL:
      ddiff = NGA_Ddot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (dtmp != 0.0) {
        ddiff /= dtmp;
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(ddiff), TOLERANCE);
        GA_Error("GA_Dgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Dgemm OK\n\n");
      }
      break;
    case C_DCPL:
      zdiff = NGA_Zdot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (ztmp.real != 0.0 || ztmp.imag != 0.0) {
        ddiff = sqrt((zdiff.real*zdiff.real+zdiff.imag*zdiff.imag)
            /(ztmp.real*ztmp.real+ztmp.imag*ztmp.imag));
      } else {
        ddiff = sqrt(zdiff.real*zdiff.real+zdiff.imag*zdiff.imag);
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(zdiff.real), TOLERANCE);
        GA_Error("GA_Zgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Zgemm OK\n\n");
      }
      break;
    case C_SCPL:
      cdiff = NGA_Cdot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (ctmp.real != 0.0 || ctmp.imag != 0.0) {
        fdiff = sqrt((cdiff.real*cdiff.real+cdiff.imag*cdiff.imag)
            /(ctmp.real*ctmp.real+ctmp.imag*ctmp.imag));
      } else {
        fdiff = sqrt(cdiff.real*cdiff.real+cdiff.imag*cdiff.imag);
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(cdiff.real), TOLERANCE);
        GA_Error("GA_Cgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Cgemm OK\n\n");
      }
      break;
    default:
      GA_Error("wrong data type", data_type);
  }

  }
#endif
  free(abuf);
  free(bbuf);
  free(cbuf);

  GA_Destroy(g_a);
  GA_Destroy(g_b);
  GA_Destroy(g_c);
}